

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCutUtils.c
# Opt level: O0

Map_Cut_t * Map_CutListAppend(Map_Cut_t *pSetAll,Map_Cut_t *pSets)

{
  Map_Cut_t *local_30;
  Map_Cut_t *pTemp;
  Map_Cut_t *pPrev;
  Map_Cut_t *pSets_local;
  Map_Cut_t *pSetAll_local;
  
  pTemp = (Map_Cut_t *)0x0;
  pSetAll_local = pSets;
  if ((pSetAll != (Map_Cut_t *)0x0) &&
     (local_30 = pSets, pSetAll_local = pSetAll, pSets != (Map_Cut_t *)0x0)) {
    for (; local_30 != (Map_Cut_t *)0x0; local_30 = local_30->pNext) {
      pTemp = local_30;
    }
    if (pTemp->pNext != (Map_Cut_t *)0x0) {
      __assert_fail("pPrev->pNext == NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCutUtils.c"
                    ,0xb1,"Map_Cut_t *Map_CutListAppend(Map_Cut_t *, Map_Cut_t *)");
    }
    pTemp->pNext = pSetAll;
    pSetAll_local = pSets;
  }
  return pSetAll_local;
}

Assistant:

Map_Cut_t * Map_CutListAppend( Map_Cut_t * pSetAll, Map_Cut_t * pSets )
{
    Map_Cut_t * pPrev = NULL; // Suppress "might be used uninitialized"
    Map_Cut_t * pTemp;
    if ( pSetAll == NULL )
        return pSets;
    if ( pSets == NULL )
        return pSetAll;
    // find the last one
    for ( pTemp = pSets; pTemp; pTemp = pTemp->pNext )
        pPrev = pTemp;
    // append all the end of the current set
    assert( pPrev->pNext == NULL );
    pPrev->pNext = pSetAll;
    return pSets;
}